

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CompilationUnitSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CompilationUnitSyntax,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::MemberSyntax> *args,Token *args_1)

{
  size_t sVar1;
  pointer ppMVar2;
  Info *pIVar3;
  SyntaxNode *pSVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  CompilationUnitSyntax *pCVar10;
  long lVar11;
  
  pCVar10 = (CompilationUnitSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CompilationUnitSyntax *)this->endPtr < pCVar10 + 1) {
    pCVar10 = (CompilationUnitSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pCVar10 + 1);
  }
  TVar6 = args_1->kind;
  uVar7 = args_1->field_0x2;
  NVar8.raw = (args_1->numFlags).raw;
  uVar9 = args_1->rawLen;
  pIVar3 = args_1->info;
  (pCVar10->super_SyntaxNode).kind = CompilationUnit;
  (pCVar10->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pCVar10->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  uVar5 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar10->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar10->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pCVar10->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (pCVar10->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pCVar10->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pCVar10->members).super_SyntaxListBase.childCount = (args->super_SyntaxListBase).childCount;
  sVar1 = (args->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (pCVar10->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pCVar10->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (pCVar10->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005bae20;
  (pCVar10->endOfFile).kind = TVar6;
  (pCVar10->endOfFile).field_0x2 = uVar7;
  (pCVar10->endOfFile).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar10->endOfFile).rawLen = uVar9;
  (pCVar10->endOfFile).info = pIVar3;
  (pCVar10->members).super_SyntaxListBase.super_SyntaxNode.parent = &pCVar10->super_SyntaxNode;
  sVar1 = (pCVar10->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppMVar2 = (pCVar10->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar11 = 0;
    do {
      *(CompilationUnitSyntax **)(*(long *)((long)ppMVar2 + lVar11) + 8) = pCVar10;
      lVar11 = lVar11 + 8;
    } while (sVar1 << 3 != lVar11);
  }
  return pCVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }